

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

int xmlBufferShrink(xmlBufferPtr buf,uint len)

{
  xmlChar *__dest;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  xmlChar *__src;
  
  uVar2 = 0xffffffff;
  if (buf != (xmlBufferPtr)0x0) {
    if (len == 0) {
      uVar2 = 0;
    }
    else {
      uVar3 = buf->use - len;
      uVar2 = 0xffffffff;
      if (len <= buf->use) {
        buf->use = uVar3;
        uVar2 = len;
        if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
          buf->content = buf->content + len;
          buf->size = buf->size - len;
        }
        else if ((buf->alloc == XML_BUFFER_ALLOC_IO) &&
                (__dest = buf->contentIO, __dest != (xmlChar *)0x0)) {
          __src = buf->content + len;
          buf->content = __src;
          uVar1 = buf->size - len;
          buf->size = uVar1;
          if ((ulong)uVar1 <= (ulong)((long)__src - (long)__dest)) {
            memmove(__dest,__src,(ulong)uVar3);
            buf->content = buf->contentIO;
            buf->contentIO[buf->use] = '\0';
            buf->size = buf->size + (int)((long)__src - (long)__dest);
          }
        }
        else {
          memmove(buf->content,buf->content + len,(ulong)uVar3);
          buf->content[buf->use] = '\0';
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int
xmlBufferShrink(xmlBufferPtr buf, unsigned int len) {
    if (buf == NULL) return(-1);
    if (len == 0) return(0);
    if (len > buf->use) return(-1);

    buf->use -= len;
    if ((buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) ||
        ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL))) {
	/*
	 * we just move the content pointer, but also make sure
	 * the perceived buffer size has shrunk accordingly
	 */
        buf->content += len;
	buf->size -= len;

        /*
	 * sometimes though it maybe be better to really shrink
	 * on IO buffers
	 */
	if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
	    size_t start_buf = buf->content - buf->contentIO;
	    if (start_buf >= buf->size) {
		memmove(buf->contentIO, &buf->content[0], buf->use);
		buf->content = buf->contentIO;
		buf->content[buf->use] = 0;
		buf->size += start_buf;
	    }
	}
    } else {
	memmove(buf->content, &buf->content[len], buf->use);
	buf->content[buf->use] = 0;
    }
    return(len);
}